

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

char * dfeature_at(int x,int y,char *buf)

{
  char cVar1;
  bool bVar2;
  level *plVar3;
  boolean bVar4;
  aligntyp alignment;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *__src;
  long lStack_40;
  
  plVar3 = level;
  cVar1 = level->locations[x][y].typ;
  switch(cVar1) {
  case '\x17':
    uVar6 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f;
    if (uVar6 == 0) {
      lStack_40 = 0x18;
LAB_001aa6b4:
      bVar2 = false;
      pcVar7 = (char *)0x0;
    }
    else {
      if (uVar6 != 1) {
        if (uVar6 == 2) {
          lStack_40 = 0x19;
        }
        else {
          lStack_40 = 0x1b;
        }
        goto LAB_001aa6b4;
      }
      pcVar7 = "broken door";
      lStack_40 = 0xffffffff;
      bVar2 = true;
    }
    iVar5 = is_drawbridge_wall(x,y);
    __src = "open drawbridge portcullis";
    if (iVar5 < 0) {
      __src = pcVar7;
    }
    if (iVar5 < 0 && !bVar2) break;
    goto LAB_001aa6fe;
  default:
    bVar4 = is_lava(level,x,y);
    if (bVar4 != '\0') {
      lStack_40 = 0x17;
      break;
    }
    bVar4 = is_swamp(level,x,y);
    if (bVar4 != '\0') {
      lStack_40 = 0x16;
      break;
    }
    bVar4 = is_ice(level,x,y);
    if (bVar4 != '\0') {
      lStack_40 = 0x15;
      break;
    }
    bVar4 = is_pool(level,x,y);
    if (bVar4 == '\0') {
      if (cVar1 == '\x1f') {
        lStack_40 = 0x2a;
        break;
      }
      if (cVar1 == '!') {
        pcVar7 = a_gname();
        uVar6 = *(uint *)&plVar3->locations[x][y].field_0x6 >> 4 & 0x17;
        if (uVar6 == 0) {
          alignment = -0x80;
        }
        else if (uVar6 == 4) {
          alignment = '\x01';
        }
        else {
          alignment = (char)uVar6 + -2;
        }
        pcVar8 = align_str(alignment);
        __src = dfeature_at::altbuf;
        sprintf(dfeature_at::altbuf,"altar to %s (%s)",pcVar7,pcVar8);
        goto LAB_001aa707;
      }
      if (((level->sstairs).sx == x) && ((level->sstairs).sy == y)) {
        lStack_40 = (ulong)((level->sstairs).up == '\0') + 0x24;
        break;
      }
      if (((level->upstair).sx == x) && ((level->upstair).sy == y)) {
        lStack_40 = 0x20;
        break;
      }
      if (((level->dnstair).sx == x) && ((level->dnstair).sy == y)) {
        lStack_40 = 0x21;
        break;
      }
      if (((level->upladder).sx == x) && ((level->upladder).sy == y)) {
        lStack_40 = 0x22;
        break;
      }
      if (((level->dnladder).sx == x) && ((level->dnladder).sy == y)) {
        lStack_40 = 0x23;
        break;
      }
      if (cVar1 == '$') {
        lStack_40 = 0x2c;
        break;
      }
      if (cVar1 == '\r') {
        lStack_40 = 0x1e;
        break;
      }
      if (cVar1 == '\x0e') {
        lStack_40 = 0x1f;
        break;
      }
      if (cVar1 == '\x16') {
        __src = "set of iron bars";
        goto LAB_001aa707;
      }
      if (cVar1 == ' ') {
        lStack_40 = 0x27;
        break;
      }
      if (cVar1 == '\f') {
        lStack_40 = 0x2e;
        break;
      }
      goto LAB_001aa86c;
    }
    __src = "pool of water";
    goto LAB_001aa707;
  case '\x1c':
    lStack_40 = 0x2b;
    break;
  case '\x1d':
    lStack_40 = 0x28;
    break;
  case '\x1e':
    lStack_40 = 0x29;
  }
  __src = defexplain[lStack_40];
LAB_001aa6fe:
  if (__src == (char *)0x0) {
LAB_001aa86c:
    __src = (char *)0x0;
  }
  else {
LAB_001aa707:
    strcpy(buf,__src);
  }
  return __src;
}

Assistant:

const char *dfeature_at(int x, int y, char *buf)
{
	struct rm *loc = &level->locations[x][y];
	int ltyp = loc->typ, cmap = -1;
	const char *dfeature = 0;
	static char altbuf[BUFSZ];

	if (IS_DOOR(ltyp)) {
	    switch (loc->doormask) {
	    case D_NODOOR:	cmap = S_ndoor; break;	/* "doorway" */
	    case D_ISOPEN:	cmap = S_vodoor; break;	/* "open door" */
	    case D_BROKEN:	dfeature = "broken door"; break;
	    default:	cmap = S_vcdoor; break;	/* "closed door" */
	    }
	    /* override door description for open drawbridge */
	    if (is_drawbridge_wall(x, y) >= 0)
		dfeature = "open drawbridge portcullis",  cmap = -1;
	} else if (IS_FOUNTAIN(ltyp))
	    cmap = S_fountain;				/* "fountain" */
	else if (IS_THRONE(ltyp))
	    cmap = S_throne;				/* "opulent throne" */
	else if (IS_MAGIC_CHEST(ltyp))
	    cmap = S_magic_chest;			/* "magic chest" */
	else if (is_lava(level, x,y))
	    cmap = S_lava;				/* "molten lava" */
	else if (is_swamp(level, x,y))
	    cmap = S_bog;				/* "muddy swamp" */
	else if (is_ice(level, x, y))
	    cmap = S_ice;				/* "ice" */
	else if (is_pool(level, x,y))
	    dfeature = "pool of water";
	else if (IS_SINK(ltyp))
	    cmap = S_sink;				/* "sink" */
	else if (IS_ALTAR(ltyp)) {
	    sprintf(altbuf, "altar to %s (%s)", a_gname(),
		    align_str(Amask2align(loc->altarmask & ~AM_SHRINE)));
	    dfeature = altbuf;
	} else if (x == level->sstairs.sx && y == level->sstairs.sy && level->sstairs.up)
            cmap = S_upsstair;                          /* "long ladder up" */
        else if (x == level->sstairs.sx && y == level->sstairs.sy)
            cmap = S_dnsstair;                          /* "long ladder down" */
        else if (x == level->upstair.sx && y == level->upstair.sy)
	    cmap = S_upstair;				/* "staircase up" */
	else if (x == level->dnstair.sx && y == level->dnstair.sy)
	    cmap = S_dnstair;				/* "staircase down" */
	else if (x == level->upladder.sx && y == level->upladder.sy)
	    cmap = S_upladder;				/* "ladder up" */
	else if (x == level->dnladder.sx && y == level->dnladder.sy)
	    cmap = S_dnladder;				/* "ladder down" */
	else if (ltyp == DRAWBRIDGE_DOWN)
	    cmap = S_vodbridge;			/* "lowered drawbridge" */
	else if (ltyp == DBWALL)
	    cmap = S_vcdbridge;			/* "raised drawbridge" */
	else if (IS_GRAVE(ltyp))
	    cmap = S_grave;				/* "grave" */
	else if (ltyp == TREE)
	    cmap = S_tree;				/* "tree" */
	else if (ltyp == DEADTREE)
	    cmap = S_deadtree;				/* "dead tree" */
	else if (ltyp == IRONBARS)
	    dfeature = "set of iron bars";

	if (cmap >= 0) dfeature = defexplain[cmap];
	if (dfeature) strcpy(buf, dfeature);
	return dfeature;
}